

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainAI.cpp
# Opt level: O1

void __thiscall tiger::trains::ai::TrainAI::makePath(TrainAI *this,World *world)

{
  PathCalculator *this_00;
  pointer ppIVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Player *pPVar6;
  IPost *pIVar7;
  undefined4 extraout_var;
  vector<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_> *pvVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  HomeChecker *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  IPost *pIVar9;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer ppIVar10;
  double dVar11;
  Point *local_70;
  double local_60;
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  local_48;
  
  pPVar6 = trains::world::Train::getPlayer(this->train);
  pIVar7 = trains::world::Player::getHome(pPVar6);
  this_00 = &this->pathCalculator;
  iVar3 = (*pIVar7->_vptr_IPost[5])();
  iVar3 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var,iVar3));
  pvVar8 = trains::world::World::getPostList(world);
  ppIVar10 = (pvVar8->
             super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppIVar1 = (pvVar8->
            super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar10 == ppIVar1) {
    local_70 = (Point *)0x0;
  }
  else {
    local_60 = 0.0;
    local_70 = (Point *)0x0;
    do {
      pIVar9 = *ppIVar10;
      iVar4 = (*pIVar9->_vptr_IPost[7])(pIVar9);
      iVar5 = (uint)(this->type == ARMOR) * 3;
      if (this->type == PRODUCT) {
        iVar5 = 2;
      }
      if (iVar4 == iVar5) {
        iVar5 = (*pIVar9->_vptr_IPost[5])(pIVar9);
        iVar5 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_00,iVar5));
        if (iVar5 != 0x7fffffff) {
          iVar5 = (*pIVar9->_vptr_IPost[5])(pIVar9);
          iVar4 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_01,iVar5));
          iVar5 = (*pIVar7->_vptr_IPost[5])();
          iVar5 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_02,iVar5));
          iVar5 = iVar5 + iVar4 * 2;
          this_01 = BotSharedData::getCheker(this->sharedData);
          bVar2 = HomeChecker::needHome(this_01,this->train,iVar5,iVar3,this->type);
          if (!bVar2) {
            iVar4 = (*pIVar9->_vptr_IPost[5])(pIVar9);
            iVar4 = PathCalculator::getMinLen(this_00,(Point *)CONCAT44(extraout_var_03,iVar4));
            iVar4 = calculateProducts(this,iVar4,pIVar9);
            dVar11 = (double)iVar4 / (double)((iVar5 - iVar3) + 1);
            if (local_60 < dVar11) {
              iVar5 = (*pIVar9->_vptr_IPost[5])(pIVar9);
              local_70 = (Point *)CONCAT44(extraout_var_04,iVar5);
              local_60 = dVar11;
            }
          }
        }
      }
      ppIVar10 = ppIVar10 + 1;
    } while (ppIVar10 != ppIVar1);
  }
  if (local_70 == (Point *)0x0) {
    pPVar6 = trains::world::Train::getPlayer(this->train);
    pIVar9 = trains::world::Player::getHome(pPVar6);
    iVar3 = (*pIVar9->_vptr_IPost[5])(pIVar9);
    local_70 = (Point *)CONCAT44(extraout_var_05,iVar3);
  }
  this->nextPoint = local_70;
  iVar3 = trains::world::Train::getGoods(this->train);
  iVar5 = trains::world::Train::getGoodsCapacity(this->train);
  if (iVar5 <= iVar3) {
    iVar3 = (*pIVar7->_vptr_IPost[5])();
    this->nextPoint = (Point *)CONCAT44(extraout_var_06,iVar3);
  }
  PathCalculator::getMinPath(&local_48,this_00,this->nextPoint);
  std::
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::_M_move_assign(&this->currentPath,&local_48);
  if (local_48.
      super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TrainAI::makePath(const world::World &world)
{

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();


    int currHomeLen = pathCalculator.getMinLen(homeTown->getPoint());
    double maxProductByTick = 0;
    world::Point *tempNext = nullptr;
    int killer = 0;

    while(true)
    {
        for (auto post : world.getPostList())
        {
            if (post->getPostType() != getPostTypeByGood(type)
                    || pathCalculator.getMinLen(post->getPoint()) == INT_MAX
               )//  || train->getPoint() == post->getPoint())
                continue;

            int tempLen = pathCalculator.getMinLen(post->getPoint())*2
                          + pathCalculator.getMinLen(homeTown->getPoint()); // TODO DIJKSTRA for MARKET/TOWN

            if (sharedData->getCheker()->needHome(train,tempLen - killer, currHomeLen, type))
                continue;




            int predict =  calculateProducts(pathCalculator.getMinLen(post->getPoint()), post);

            if (((double)predict)/(tempLen-currHomeLen + 1) > maxProductByTick)
            {
                tempNext = post->getPoint();
                maxProductByTick = ((double)predict)/(tempLen-currHomeLen + 1);
            }

        }

//        if (lastPoint != homeTown->getPoint() || maxProductByTick > homeTown->getPopulation() -  killer)
        break;

//        killer++;
    }

    if (tempNext == nullptr)
        nextPoint = train->getPlayer()->getHome()->getPoint();
    else
        nextPoint = tempNext;


    if (train->getGoods() >= train->getGoodsCapacity())
        nextPoint = homeTown->getPoint();

    currentPath = pathCalculator.getMinPath(nextPoint);

}